

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O3

REF_STATUS
ref_smooth_local_cell_about
          (REF_CELL ref_cell,REF_NODE ref_node,REF_INT about_node,REF_BOOL *allowed)

{
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  int in_EAX;
  long lVar3;
  ulong uVar4;
  
  *allowed = 0;
  if ((-1 < about_node) && (pRVar1 = ref_cell->ref_adj, about_node < pRVar1->nnode)) {
    in_EAX = pRVar1->first[(uint)about_node];
    lVar3 = (long)in_EAX;
    if (lVar3 != -1) {
      pRVar2 = pRVar1->item + lVar3;
      while( true ) {
        if (0 < ref_cell->node_per) {
          uVar4 = 0;
          do {
            if (ref_node->ref_mpi->id !=
                ref_node->part[ref_cell->c2n[(long)ref_cell->size_per * (long)pRVar2->ref + uVar4]])
            {
              return (int)lVar3;
            }
            uVar4 = uVar4 + 1;
          } while ((uint)ref_cell->node_per != uVar4);
        }
        pRVar2 = ref_cell->ref_adj->item;
        in_EAX = pRVar2[(int)lVar3].next;
        lVar3 = (long)in_EAX;
        if (lVar3 == -1) break;
        pRVar2 = pRVar2 + lVar3;
      }
    }
  }
  *allowed = 1;
  return in_EAX;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_local_cell_about(REF_CELL ref_cell,
                                                      REF_NODE ref_node,
                                                      REF_INT about_node,
                                                      REF_BOOL *allowed) {
  REF_INT item, cell, node;

  *allowed = REF_FALSE;

  each_ref_cell_having_node(ref_cell, about_node, item, cell) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        return REF_SUCCESS;
      }
    }
  }
  *allowed = REF_TRUE;

  return REF_SUCCESS;
}